

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

void __thiscall QResourcePrivate::ensureInitialized(QResourcePrivate *this)

{
  QChar c;
  QChar c_00;
  QChar c_01;
  bool bVar1;
  QString *this_00;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char16_t,_const_QString_&> QVar2;
  QResourcePrivate *that;
  QString searchPath;
  QStringView path;
  QStringBuilder<char16_t,_QStringView_&> *in_stack_fffffffffffffeb8;
  QStringView *in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec8;
  QChar in_stack_fffffffffffffece;
  QStringView *in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  qsizetype in_stack_fffffffffffffee0;
  qsizetype in_stack_fffffffffffffee8;
  undefined6 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff36;
  QChar local_4a;
  QStringView local_48;
  QChar local_32;
  undefined1 *local_30;
  storage_type_conflict *local_28;
  QChar local_1e;
  QChar local_1c;
  QChar local_1a;
  QLatin1StringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QList<(anonymous_namespace)::QResourceRoot_*>::isEmpty
                    ((QList<(anonymous_namespace)::QResourceRoot_*> *)0x2e6814);
  if ((bVar1) &&
     (bVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
              ::isDestroyed((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                             *)0x2e6829), !bVar1)) {
    local_18 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT26(in_stack_fffffffffffffece.ucs,in_stack_fffffffffffffec8),
                          (size_t)in_stack_fffffffffffffec0);
    bVar1 = ::operator==((QString *)
                         CONCAT26(in_stack_fffffffffffffece.ucs,in_stack_fffffffffffffec8),
                         (QLatin1StringView *)in_stack_fffffffffffffec0);
    if (bVar1) {
      QChar::QChar<char16_t,_true>(&local_1a,L'/');
      QString::operator+=((QString *)in_stack_fffffffffffffec0,in_stack_fffffffffffffece);
    }
    QString::operator=((QString *)in_stack_fffffffffffffec0,(QString *)in_stack_fffffffffffffeb8);
    QChar::QChar<char16_t,_true>(&local_1c,L':');
    c.ucs._1_1_ = in_stack_fffffffffffffedf;
    c.ucs._0_1_ = in_stack_fffffffffffffede;
    bVar1 = QString::startsWith((QString *)
                                CONCAT26(in_stack_fffffffffffffece.ucs,in_stack_fffffffffffffec8),c,
                                (CaseSensitivity)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    if (!bVar1) {
      QChar::QChar<char16_t,_true>(&local_1e,L':');
      QString::prepend((QString *)in_stack_fffffffffffffec0,in_stack_fffffffffffffece);
    }
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QStringView::QStringView<QString,_true>
              (in_stack_fffffffffffffed0,
               (QString *)CONCAT26(in_stack_fffffffffffffece.ucs,in_stack_fffffffffffffec8));
    QChar::QChar<char16_t,_true>(&local_32,L':');
    c_00.ucs._1_1_ = in_stack_fffffffffffffedf;
    c_00.ucs._0_1_ = in_stack_fffffffffffffede;
    bVar1 = QStringView::startsWith(in_stack_fffffffffffffed0,c_00);
    if (bVar1) {
      local_48 = QStringView::mid((QStringView *)
                                  CONCAT17(in_stack_fffffffffffffedf,
                                           CONCAT16(in_stack_fffffffffffffede,
                                                    in_stack_fffffffffffffed8)),
                                  in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      local_30 = (undefined1 *)local_48.m_size;
      local_28 = local_48.m_data;
    }
    QChar::QChar<char16_t,_true>(&local_4a,L'/');
    c_01.ucs._1_1_ = in_stack_fffffffffffffedf;
    c_01.ucs._0_1_ = in_stack_fffffffffffffede;
    bVar1 = QStringView::startsWith(in_stack_fffffffffffffed0,c_01);
    if (bVar1) {
      QStringView::toString(in_stack_fffffffffffffec0);
      load((QResourcePrivate *)CONCAT26(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30),in_RDI)
      ;
      QString::~QString((QString *)0x2e6a45);
    }
    else {
      ::operator+((char16_t *)in_stack_fffffffffffffec0,(QStringView *)in_stack_fffffffffffffeb8);
      ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffeb8);
      bVar1 = load((QResourcePrivate *)CONCAT26(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)
                   ,in_RDI);
      if (bVar1) {
        QVar2 = ::operator+((char16_t *)in_stack_fffffffffffffec0,
                            (QString *)in_stack_fffffffffffffeb8);
        this_00 = QVar2.b;
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<char16_t,_const_QString_&> *)in_stack_fffffffffffffeb8);
        QString::operator=(this_00,(QString *)in_stack_fffffffffffffeb8);
        QString::~QString((QString *)0x2e6b73);
      }
      QString::~QString((QString *)0x2e6ba3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QResourcePrivate::ensureInitialized() const
{
    if (!related.isEmpty())
        return;
    if (resourceGlobalData.isDestroyed())
        return;
    QResourcePrivate *that = const_cast<QResourcePrivate *>(this);
    if (fileName == ":"_L1)
        that->fileName += u'/';
    that->absoluteFilePath = fileName;
    if (!that->absoluteFilePath.startsWith(u':'))
        that->absoluteFilePath.prepend(u':');

    QStringView path(fileName);
    if (path.startsWith(u':'))
        path = path.mid(1);

    if (path.startsWith(u'/')) {
        that->load(path.toString());
    } else {
        // Should we search QDir::searchPath() before falling back to root ?
        const QString searchPath(u'/' + path);
        if (that->load(searchPath))
            that->absoluteFilePath = u':' + searchPath;
    }
}